

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_event.cpp
# Opt level: O0

void __thiscall sc_core::sc_event::cancel(sc_event *this)

{
  sc_event *in_RDI;
  sc_simcontext *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI->m_notify_type == DELTA) {
    sc_simcontext::remove_delta_event(unaff_retaddr,in_RDI);
    in_RDI->m_notify_type = NONE;
  }
  else if (in_RDI->m_notify_type == TIMED) {
    if (in_RDI->m_timed == (sc_event_timed *)0x0) {
      sc_assertion_failed((char *)CONCAT44(2,in_stack_fffffffffffffff0),(char *)in_RDI,0);
    }
    in_RDI->m_timed->m_event = (sc_event *)0x0;
    in_RDI->m_timed = (sc_event_timed *)0x0;
    in_RDI->m_notify_type = NONE;
  }
  return;
}

Assistant:

void
sc_event::cancel()
{
    // cancel a delta or timed notification
    switch( m_notify_type ) {
    case DELTA: {
        // remove this event from the delta events set
        m_simc->remove_delta_event( this );
        m_notify_type = NONE;
        break;
    }
    case TIMED: {
        // remove this event from the timed events set
        sc_assert( m_timed != 0 );
        m_timed->m_event = 0;
        m_timed = 0;
        m_notify_type = NONE;
        break;
    }
    default:
        ;
    }
}